

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O2

void __thiscall ColorTest_copy_Test::~ColorTest_copy_Test(ColorTest_copy_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ColorTest, copy) {
	color color_value{ g_constexpr_color };
	color color_rgb{ 0x12, 0x34, 0x56 };

	EXPECT_EQ(color_value, color_rgb);
	EXPECT_EQ(color_value.value(), g_constexpr_color.value());
	EXPECT_EQ(color_value.red(), 0x12);
	EXPECT_EQ(color_value.green(), 0x34);
	EXPECT_EQ(color_value.blue(), 0x56);
}